

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

istream * __thiscall amrex::DistributionMapping::readFrom(DistributionMapping *this,istream *is)

{
  element_type *this_00;
  pointer piVar1;
  istream *this_01;
  int *x;
  pointer piVar2;
  int n;
  
  Ref::clear((this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  this_00 = (this->m_ref).
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (istream *)std::istream::ignore((long)is,100000);
  std::istream::operator>>(this_01,&n);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(long)n);
  piVar1 = (((_Vector_base<int,_std::allocator<int>_> *)&this_00->m_pmap)->_M_impl).
           super__Vector_impl_data._M_finish;
  for (piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&this_00->m_pmap)->_M_impl).
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    std::istream::operator>>((istream *)is,piVar2);
  }
  std::istream::ignore((long)is,100000);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("DistributionMapping::readFrom(istream&) failed");
  }
  return is;
}

Assistant:

std::istream&
DistributionMapping::readFrom (std::istream& is)
{
    AMREX_ASSERT(size() == 0);
    m_ref->clear();
    auto& pmap = m_ref->m_pmap;

    int n;
    is.ignore(100000, '(') >> n;
    pmap.resize(n);
    for (auto& x : pmap) {
        is >> x;
    }
    is.ignore(100000, ')');
    if (is.fail()) {
        amrex::Error("DistributionMapping::readFrom(istream&) failed");
    }
    return is;
}